

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_eigen.hpp
# Opt level: O0

Tensor<1> __thiscall Omega_h::exp_spd_old<1>(Omega_h *this,Tensor<1> m)

{
  int iVar1;
  int iVar2;
  double extraout_XMM0_Qa;
  Real extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double dVar3;
  double local_918;
  double local_8e8;
  double local_8e0;
  int local_8bc;
  Int i_5;
  DiagDecomp<1> decomp;
  Tensor<1> m_local;
  DiagDecomp<1> decomp_1;
  Real nm;
  Few<Omega_h::Vector<1>,_1> local_820;
  int local_814;
  Int i_4;
  double local_808;
  Vector<1> local_800;
  Vector<1> c_2;
  int local_774;
  Int j_7;
  Few<Omega_h::Vector<1>,_1> local_760;
  Matrix<1,_1> c_8;
  int local_71c;
  Int j_4;
  Matrix<1,_1> c_3;
  int local_6e0;
  int local_6dc;
  Int j_6;
  Int i_11;
  Matrix<1,_1> b;
  int local_688;
  int local_684;
  Int i;
  Int j;
  Real x;
  double local_668;
  int local_65c;
  Real *local_658;
  int local_64c;
  Real *local_648;
  double local_630;
  int local_61c;
  double dStack_618;
  Int j_2;
  Few<Omega_h::Vector<1>,_1> local_610 [2];
  Matrix<1,_1> c;
  Few<double,_1> roots;
  Roots<1> roots_obj;
  Matrix<1,_1> o;
  int local_530;
  int local_52c;
  Int i_1;
  Int j_1;
  Matrix<1,_1> a;
  int local_4f4;
  Int i_2;
  Vector<1> local_4e8;
  Vector<1> v;
  int local_4cc;
  Int i_3;
  Few<double,_1> local_4c0;
  double local_4b8;
  Vector<1> c_1;
  Few<double,_1> poly;
  Vector<1> v_1;
  Few<double,_1> coeffs;
  undefined1 local_404 [4];
  undefined1 auStack_400 [4];
  Few<int,_1> mults;
  Few<double,_1> roots_1;
  double a_1;
  undefined1 local_3e8 [12];
  undefined4 local_3dc;
  undefined1 *local_3d8;
  undefined4 local_3cc;
  undefined1 *local_3c8;
  undefined4 local_3bc;
  undefined1 *local_3b8;
  undefined8 local_3b0;
  undefined4 local_3a4;
  undefined8 *local_3a0;
  undefined4 local_394;
  undefined8 *local_390;
  double local_388;
  Real bm;
  Real am;
  double local_360;
  double local_358;
  Real local_350;
  int local_344;
  int local_340;
  Int i_7;
  Int j_3;
  Int i_6;
  Tensor<1> a_2;
  int local_294;
  Int j_5;
  double local_288 [3];
  Vector<1> c_4;
  int local_22c;
  Int i_9;
  double local_220 [2];
  Vector<1> c_6;
  int local_1ec;
  Int i_8;
  double local_1e0 [2];
  Vector<1> c_5;
  int local_18c;
  Int j_8;
  double local_180 [3];
  Vector<1> c_9;
  int local_124;
  Int i_13;
  double local_118 [2];
  Vector<1> c_11;
  int local_e4;
  Int i_12;
  double local_d8 [2];
  Vector<1> c_10;
  int local_a4;
  Int i_14;
  double local_98 [2];
  Vector<1> c_12;
  int local_54;
  Int i_10;
  double local_48 [2];
  Vector<1> c_7;
  
  _i = 0.0;
  decomp.l.super_Few<double,_1>.array_[0] =
       (Few<double,_1>)
       (Few<double,_1>)m.super_Few<Omega_h::Vector<1>,_1>.array_[0].super_Few<double,_1>.array_[0];
  x = (Real)m.super_Few<Omega_h::Vector<1>,_1>.array_[0].super_Few<double,_1>.array_[0];
  for (local_684 = 0; iVar2 = (int)this, local_684 < 1; local_684 = local_684 + 1) {
    for (local_688 = 0; local_688 < 1; local_688 = local_688 + 1) {
      local_648 = &x;
      local_64c = local_684;
      local_658 = local_648 + local_684;
      local_65c = local_688;
      std::abs((int)this);
      local_668 = _i;
      local_8e0 = extraout_XMM0_Qa;
      if (extraout_XMM0_Qa <= _i) {
        local_8e0 = _i;
      }
      _i = local_8e0;
    }
  }
  if (1e-10 < _i) {
    dStack_618 = _i;
    for (local_61c = 0; local_61c < 1; local_61c = local_61c + 1) {
      local_630 = local_610[local_61c].array_[0].super_Few<double,_1>.array_[0];
      for (local_4cc = 0; local_4cc < 1; local_4cc = local_4cc + 1) {
        iVar1 = local_4cc;
        (&c_1)[(long)local_4cc + -1].super_Few<double,_1>.array_[0] =
             (&local_4c0)[local_4cc].array_[0] / _i;
        c_1.super_Few<double,_1>.array_[0]._4_4_ = iVar1;
      }
      iVar1 = local_61c;
      (&c)[(long)local_61c + -1].super_Few<Omega_h::Vector<1>,_1>.array_[0].super_Few<double,_1>.
      array_[0] = local_4b8;
      c.super_Few<Omega_h::Vector<1>,_1>.array_[0].super_Few<double,_1>.array_[0]._4_4_ = iVar1;
      local_4c0.array_[0] = (double  [1])(double  [1])local_630;
    }
    local_3b0 = local_610[1].array_[0].super_Few<double,_1>.array_[0];
    local_3a0 = &local_3b0;
    local_394 = 0;
    local_3a4 = 0;
    local_3c8 = local_3e8;
    local_3cc = 0;
    local_3d8 = auStack_400;
    local_3dc = 0;
    local_3b8 = local_404;
    local_3bc = 0;
    am = 1e-10;
    local_610[0].array_[0].super_Few<double,_1>.array_[0] =
         (Vector<1>  [1])
         (Vector<1>  [1])m.super_Few<Omega_h::Vector<1>,_1>.array_[0].super_Few<double,_1>.array_[0]
    ;
    local_390 = local_3a0;
    std::abs(iVar2);
    bm = extraout_XMM0_Qa_00;
    std::abs(iVar2);
    if ((am < bm) || (am < extraout_XMM0_Qa_01)) {
      local_388 = extraout_XMM0_Qa_01;
      std::abs(iVar2);
      local_350 = bm;
      local_358 = local_388;
      if (local_388 <= bm) {
        local_918 = bm;
      }
      else {
        local_918 = local_388;
      }
      local_360 = extraout_XMM0_Qa_02 / local_918;
    }
    else {
      local_360 = 0.0;
    }
    if (1e-10 < local_360) {
      fail("assertion %s failed at %s +%d\n","are_close(roots[0], m[0][0])",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_eigen.hpp"
           ,0x123);
    }
    for (local_814 = 0; local_814 < 1; local_814 = local_814 + 1) {
      iVar2 = local_814;
      (&c_2)[(long)local_814 + -1].super_Few<double,_1>.array_[0] = (&local_808)[local_814] * _i;
      c_2.super_Few<double,_1>.array_[0]._4_4_ = iVar2;
    }
    local_820.array_[0].super_Few<double,_1>.array_[0] =
         (Vector<1>  [1])(Vector<1>  [1])local_800.super_Few<double,_1>.array_[0];
  }
  else {
    for (local_52c = 0; local_52c < 1; local_52c = local_52c + 1) {
      for (local_530 = 0; local_530 < 1; local_530 = local_530 + 1) {
        local_8e8 = 1.0;
        if (local_530 != local_52c) {
          local_8e8 = 0.0;
        }
        iVar2 = local_530;
        (&a)[(long)local_52c + (long)local_530 + -1].super_Few<Omega_h::Vector<1>,_1>.array_[0].
        super_Few<double,_1>.array_[0] = local_8e8;
        a.super_Few<Omega_h::Vector<1>,_1>.array_[0].super_Few<double,_1>.array_[0]._4_4_ = iVar2;
      }
    }
    for (local_4f4 = 0; local_4f4 < 1; local_4f4 = local_4f4 + 1) {
      iVar2 = local_4f4;
      (&v)[(long)local_4f4 + -1].super_Few<double,_1>.array_[0] = 0.0;
      v.super_Few<double,_1>.array_[0]._4_4_ = iVar2;
    }
    local_820.array_[0].super_Few<double,_1>.array_[0] =
         (Vector<1>  [1])(Vector<1>  [1])local_4e8.super_Few<double,_1>.array_[0];
  }
  decomp.q.super_Few<Omega_h::Vector<1>,_1>.array_[0].super_Few<double,_1>.array_[0] =
       (Few<Omega_h::Vector<1>,_1>)
       (Few<Omega_h::Vector<1>,_1>)local_820.array_[0].super_Few<double,_1>.array_[0];
  for (local_8bc = 0; local_8bc < 1; local_8bc = local_8bc + 1) {
    dVar3 = exp((&decomp.q)[local_8bc].super_Few<Omega_h::Vector<1>,_1>.array_[0].
                super_Few<double,_1>.array_[0]);
    (&decomp.q)[local_8bc].super_Few<Omega_h::Vector<1>,_1>.array_[0].super_Few<double,_1>.array_[0]
         = dVar3;
  }
  for (i_7 = 0; local_340 = i_7, i_7 < 1; i_7 = i_7 + 1) {
    while (local_340 = local_340 + 1, local_340 < 1) {
      (&a_2)[(long)local_340 + (long)i_7 + -1].super_Few<Omega_h::Vector<1>,_1>.array_[0].
      super_Few<double,_1>.array_[0] = 0.0;
      (&a_2)[(long)i_7 + (long)local_340 + -1].super_Few<Omega_h::Vector<1>,_1>.array_[0].
      super_Few<double,_1>.array_[0] = 0.0;
    }
  }
  for (local_344 = 0; local_344 < 1; local_344 = local_344 + 1) {
    (&a_2)[(long)local_344 + (long)local_344 + -1].super_Few<Omega_h::Vector<1>,_1>.array_[0].
    super_Few<double,_1>.array_[0] = *(double *)(&j_3 + (long)local_344 * 2);
  }
  for (local_71c = 0; local_71c < 1; local_71c = local_71c + 1) {
    dVar3 = *(double *)(&stack0xfffffffffffff8e8 + (long)local_71c * 8);
    for (local_1ec = 0; local_1ec < 1; local_1ec = local_1ec + 1) {
      (&c_5)[(long)local_1ec + -1].super_Few<double,_1>.array_[0] = local_1e0[local_1ec] * dVar3;
    }
    local_288[2] = local_1e0[1];
    for (local_294 = 1; local_294 < 1; local_294 = local_294 + 1) {
      dVar3 = local_288[local_294];
      for (local_22c = 0; local_22c < 1; local_22c = local_22c + 1) {
        (&c_6)[(long)local_22c + -1].super_Few<double,_1>.array_[0] = local_220[local_22c] * dVar3;
      }
      for (local_54 = 0; local_54 < 1; local_54 = local_54 + 1) {
        (&c_7)[(long)local_54 + -1].super_Few<double,_1>.array_[0] =
             local_48[local_54] + *(double *)(&stack0xffffffffffffffb0 + (long)local_54 * 8);
      }
      local_288[2] = local_48[1];
    }
    (&c_3)[(long)local_71c + -1].super_Few<Omega_h::Vector<1>,_1>.array_[0].super_Few<double,_1>.
    array_[0] = local_288[2];
  }
  for (local_6dc = 0; local_6dc < 1; local_6dc = local_6dc + 1) {
    for (local_6e0 = 0; local_6e0 < 1; local_6e0 = local_6e0 + 1) {
      (&b)[(long)local_6dc + (long)local_6e0 + -1].super_Few<Omega_h::Vector<1>,_1>.array_[0].
      super_Few<double,_1>.array_[0] = *(double *)(&j_6 + (long)local_6e0 * 2 + (long)local_6dc * 2)
      ;
    }
  }
  for (local_774 = 0; local_774 < 1; local_774 = local_774 + 1) {
    dVar3 = *(double *)(&stack0xfffffffffffff890 + (long)local_774 * 8);
    for (local_e4 = 0; local_e4 < 1; local_e4 = local_e4 + 1) {
      (&c_10)[(long)local_e4 + -1].super_Few<double,_1>.array_[0] = local_d8[local_e4] * dVar3;
    }
    local_180[2] = local_d8[1];
    for (local_18c = 1; local_18c < 1; local_18c = local_18c + 1) {
      dVar3 = local_180[local_18c];
      for (local_124 = 0; local_124 < 1; local_124 = local_124 + 1) {
        (&c_11)[(long)local_124 + -1].super_Few<double,_1>.array_[0] = local_118[local_124] * dVar3;
      }
      for (local_a4 = 0; local_a4 < 1; local_a4 = local_a4 + 1) {
        (&c_12)[(long)local_a4 + -1].super_Few<double,_1>.array_[0] =
             local_98[local_a4] + *(double *)(&stack0xffffffffffffff60 + (long)local_a4 * 8);
      }
      local_180[2] = local_98[1];
    }
    (&c_8)[(long)local_774 + -1].super_Few<Omega_h::Vector<1>,_1>.array_[0].super_Few<double,_1>.
    array_[0] = local_180[2];
  }
  return (Few<Omega_h::Vector<1>,_1>)
         (Few<Omega_h::Vector<1>,_1>)local_760.array_[0].super_Few<double,_1>.array_[0];
}

Assistant:

OMEGA_H_INLINE_BIG Tensor<dim> exp_spd_old(
    Tensor<dim> const m) OMEGA_H_NOEXCEPT {
  auto decomp = decompose_eigen(m);
  for (Int i = 0; i < dim; ++i) decomp.l[i] = std::exp(decomp.l[i]);
  return compose_ortho(decomp.q, decomp.l);
}